

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::FastGeneralizationsIterator::
init<Kernel::TypedTermList>
          (FastGeneralizationsIterator *this,
          SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs> *parent,Node *root,
          TypedTermList query,bool retrieveSubstitution,bool reversed)

{
  int *piVar1;
  TermList *pTVar2;
  int iVar3;
  VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> local_30;
  
  this->_retrieveSubstitution = retrieveSubstitution;
  iVar3 = (*root->_vptr_Node[2])(root);
  this->_inLeaf = SUB41(iVar3,0);
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::GenMatcher::init<Kernel::TypedTermList>
            (&this->_subst,query,parent->_nextVar);
  if (this->_inLeaf == true) {
    (*root->_vptr_Node[8])(&local_30,root);
  }
  else {
    Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::getEmpty();
  }
  Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::operator=
            (&this->_ldIterator,&local_30);
  if (local_30._core != (IteratorCore<Inferences::ALASCA::Demodulation::Rhs_*> *)0x0) {
    piVar1 = &(local_30._core)->_refCnt;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(local_30._core)->_vptr_IteratorCore[1])();
    }
  }
  this->_root = root;
  pTVar2 = (this->_subst)._specVars._array;
  pTVar2->_content = query.super_TermList._content._content;
  pTVar2[1]._content = query._sort._content._content;
  return;
}

Assistant:

void init(SubstitutionTree* parent, Node* root, TermOrLit query, bool retrieveSubstitution, bool reversed) {
        _retrieveSubstitution = retrieveSubstitution;
        _inLeaf = root->isLeaf();
        _subst.init(query, parent->_nextVar);
        _ldIterator = _inLeaf ? static_cast<Leaf*>(root)->allChildren() : LDIterator::getEmpty();
        _root = root;

        _iterCntr = parent->_iterCnt;
        ASS(root);

        parent->createBindings(query, reversed,
            [&](unsigned var, TermList t) { _subst.bindSpecialVar(var, t); });
      }